

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_array.cpp
# Opt level: O2

void f2c(ct22 *a)

{
  uint uVar1;
  ostream *poVar2;
  long lVar3;
  scoped_lock l;
  
  if ((second_round) && ((int)x.super___atomic_base<int>._M_i < 0)) {
    uVar1 = 1;
  }
  else {
    uVar1 = 0;
    if (!second_round) {
      uVar1 = ~(uint)x.super___atomic_base<int>._M_i >> 0x1f;
    }
  }
  LOCK();
  success_counter.super___atomic_base<int>._M_i =
       (__atomic_base<int>)((int)success_counter.super___atomic_base<int>._M_i + uVar1);
  UNLOCK();
  spin_mutex_t::lock(&my_io_mutex);
  poVar2 = std::operator<<((ostream *)&std::cerr,"f2c ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(*a)[0]);
  std::operator<<(poVar2," begin: ");
  lVar3 = std::chrono::_V2::system_clock::now();
  poVar2 = std::ostream::_M_insert<double>((double)(lVar3 - (long)t0.__d.__r) / 1000000000.0);
  std::endl<char,std::char_traits<char>>(poVar2);
  my_io_mutex.lock_.super___atomic_flag_base._M_i = (atomic_flag)(__atomic_flag_base)0x0;
  uVar1 = 1;
  fun(true,600);
  spin_mutex_t::lock(&my_io_mutex);
  poVar2 = std::operator<<((ostream *)&std::cerr,"f2c ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(*a)[0]);
  std::operator<<(poVar2," end: ");
  lVar3 = std::chrono::_V2::system_clock::now();
  poVar2 = std::ostream::_M_insert<double>((double)(lVar3 - (long)t0.__d.__r) / 1000000000.0);
  std::endl<char,std::char_traits<char>>(poVar2);
  my_io_mutex.lock_.super___atomic_flag_base._M_i = (atomic_flag)(__atomic_flag_base)0x0;
  LOCK();
  x.super___atomic_base<int>._M_i =
       (__atomic_base<int>)((int)x.super___atomic_base<int>._M_i + 0x20);
  UNLOCK();
  if (((second_round != true) || (-1 < (int)x.super___atomic_base<int>._M_i)) &&
     (uVar1 = 0, (second_round & 1U) == 0)) {
    uVar1 = ~(uint)x.super___atomic_base<int>._M_i >> 0x1f;
  }
  LOCK();
  success_counter.super___atomic_base<int>._M_i =
       (__atomic_base<int>)((int)success_counter.super___atomic_base<int>._M_i + uVar1);
  UNLOCK();
  return;
}

Assistant:

void f2c(const ct22& a)
{ 
  success_counter.fetch_add((second_round && (x<0)) || (!second_round && (x>=0)));
  LOG("f2c " << a[0] << " begin: " << std::chrono::duration<double>(std::chrono::high_resolution_clock::now() - t0).count()); 
  //a[0]++;
  fun(true);
  LOG("f2c " << a[0] << " end: " << std::chrono::duration<double>(std::chrono::high_resolution_clock::now() - t0).count());
  x.fetch_add(32);
  success_counter.fetch_add((second_round && (x<0)) || (!second_round && (x>=0)));
}